

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

int defineAttribute(ELEMENT_TYPE *type,ATTRIBUTE_ID *attId,XML_Bool isCdata,XML_Bool isId,
                   XML_Char *value,XML_Parser parser)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  DEFAULT_ATTRIBUTE *pDVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  if ((int)CONCAT71(in_register_00000009,isId) != 0 || value != (XML_Char *)0x0) {
    uVar5 = (ulong)type->nDefaultAtts;
    bVar7 = 0 < (long)uVar5;
    if ((long)uVar5 < 1) {
LAB_006dd0c0:
      if (((isId != '\0') && (type->idAtt == (ATTRIBUTE_ID *)0x0)) && (attId->xmlns == '\0')) {
        type->idAtt = attId;
      }
    }
    else {
      pDVar4 = type->defaultAtts;
      if (pDVar4->id != attId) {
        uVar2 = 1;
        do {
          uVar3 = uVar2;
          pDVar4 = pDVar4 + 1;
          if (uVar5 == uVar3) {
            bVar7 = uVar3 < uVar5;
            goto LAB_006dd0c0;
          }
          uVar2 = uVar3 + 1;
        } while (pDVar4->id != attId);
        bVar7 = uVar3 < uVar5;
      }
    }
    if (bVar7) {
      return 1;
    }
  }
  iVar1 = type->allocDefaultAtts;
  if (type->nDefaultAtts == iVar1) {
    if (iVar1 == 0) {
      type->allocDefaultAtts = 8;
      pDVar4 = (DEFAULT_ATTRIBUTE *)(*(parser->m_mem).malloc_fcn)(0xc0);
      type->defaultAtts = pDVar4;
      if (pDVar4 == (DEFAULT_ATTRIBUTE *)0x0) {
        type->allocDefaultAtts = 0;
        return 0;
      }
    }
    else {
      iVar6 = 0;
      if (iVar1 < 0x40000000) {
        pDVar4 = (DEFAULT_ATTRIBUTE *)
                 (*(parser->m_mem).realloc_fcn)(type->defaultAtts,(long)iVar1 * 0x30);
        bVar7 = pDVar4 != (DEFAULT_ATTRIBUTE *)0x0;
        if (bVar7) {
          type->allocDefaultAtts = iVar1 * 2;
          type->defaultAtts = pDVar4;
          iVar6 = 1;
          bVar7 = true;
        }
      }
      else {
        bVar7 = false;
      }
      if (!bVar7) {
        return iVar6;
      }
    }
  }
  pDVar4 = type->defaultAtts;
  iVar1 = type->nDefaultAtts;
  pDVar4[iVar1].id = attId;
  pDVar4[iVar1].value = value;
  pDVar4[iVar1].isCdata = isCdata;
  if (isCdata == '\0') {
    attId->maybeTokenized = '\x01';
  }
  type->nDefaultAtts = iVar1 + 1;
  return 1;
}

Assistant:

static int
defineAttribute(ELEMENT_TYPE *type, ATTRIBUTE_ID *attId, XML_Bool isCdata,
                XML_Bool isId, const XML_Char *value, XML_Parser parser) {
  DEFAULT_ATTRIBUTE *att;
  if (value || isId) {
    /* The handling of default attributes gets messed up if we have
       a default which duplicates a non-default. */
    int i;
    for (i = 0; i < type->nDefaultAtts; i++)
      if (attId == type->defaultAtts[i].id)
        return 1;
    if (isId && ! type->idAtt && ! attId->xmlns)
      type->idAtt = attId;
  }
  if (type->nDefaultAtts == type->allocDefaultAtts) {
    if (type->allocDefaultAtts == 0) {
      type->allocDefaultAtts = 8;
      type->defaultAtts = (DEFAULT_ATTRIBUTE *)MALLOC(
          parser, type->allocDefaultAtts * sizeof(DEFAULT_ATTRIBUTE));
      if (! type->defaultAtts) {
        type->allocDefaultAtts = 0;
        return 0;
      }
    } else {
      DEFAULT_ATTRIBUTE *temp;

      /* Detect and prevent integer overflow */
      if (type->allocDefaultAtts > INT_MAX / 2) {
        return 0;
      }

      int count = type->allocDefaultAtts * 2;

      /* Detect and prevent integer overflow.
       * The preprocessor guard addresses the "always false" warning
       * from -Wtype-limits on platforms where
       * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
      if ((unsigned)count > (size_t)(-1) / sizeof(DEFAULT_ATTRIBUTE)) {
        return 0;
      }
#endif

      temp = (DEFAULT_ATTRIBUTE *)REALLOC(parser, type->defaultAtts,
                                          (count * sizeof(DEFAULT_ATTRIBUTE)));
      if (temp == NULL)
        return 0;
      type->allocDefaultAtts = count;
      type->defaultAtts = temp;
    }
  }
  att = type->defaultAtts + type->nDefaultAtts;
  att->id = attId;
  att->value = value;
  att->isCdata = isCdata;
  if (! isCdata)
    attId->maybeTokenized = XML_TRUE;
  type->nDefaultAtts += 1;
  return 1;
}